

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
visitSelect(wasm::Select__(void *this,Select *curr)

{
  bool bVar1;
  Ref RVar2;
  Ref RVar3;
  Ref RVar4;
  Value *pVVar5;
  Ref RVar6;
  Ref ifTrue;
  Ref ifFalse;
  undefined1 *puVar7;
  IString possible;
  IString possible_00;
  IString possible_01;
  IString nextResult;
  IString nextResult_00;
  IString nextResult_01;
  IString op;
  IString op_00;
  IString op_01;
  IString nextResult_02;
  IString nextResult_03;
  IString nextResult_04;
  undefined1 local_528 [8];
  EffectAnalyzer conditionEffects;
  EffectAnalyzer ifTrueEffects;
  EffectAnalyzer ifFalseEffects;
  ScopedTemp tempIfTrue;
  ScopedTemp tempIfFalse;
  ScopedTemp tempCondition;
  
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)local_528,(PassOptions *)(*this + 0x60),
             *(Module **)((long)this + 0x20),curr->condition);
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PassOptions *)(*this + 0x60),*(Module **)((long)this + 0x20),curr->ifTrue);
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PassOptions *)(*this + 0x60),*(Module **)((long)this + 0x20),curr->ifFalse);
  bVar1 = EffectAnalyzer::invalidates
                    ((EffectAnalyzer *)local_528,
                     (EffectAnalyzer *)
                     &conditionEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
  if (!bVar1) {
    bVar1 = EffectAnalyzer::invalidates
                      ((EffectAnalyzer *)local_528,
                       (EffectAnalyzer *)
                       &ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                        _M_node_count);
    if (((((((!bVar1) && (ifTrueEffects.readsMemory == false)) &&
           (ifTrueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            (_Base_ptr)0x0)) &&
          (((char)ifTrueEffects.catchDepth == '\0' &&
           (ifTrueEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            (_Base_ptr)0x0)))) &&
         (ifTrueEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ ==
          '\0')) &&
        (((((ifTrueEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ ==
             '\0' && (ifTrueEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                      _5_1_ == '\0')) &&
           ((ifTrueEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ ==
             '\0' && (((ifTrueEffects.readsTable == false && (ifTrueEffects.module._5_1_ == '\0'))
                      && (ifTrueEffects.writesTable == false)))))) &&
          ((ifTrueEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
            (_Base_ptr)0x0 && (ifTrueEffects.module._4_1_ == '\0')))) &&
         (ifTrueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
          (_Base_ptr)0x0)))) &&
       ((((ifFalseEffects.readsMemory == false &&
          (ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
           (_Base_ptr)0x0)) &&
         (((char)ifFalseEffects.catchDepth == '\0' &&
          (((ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
             (_Base_ptr)0x0 &&
            (ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ ==
             '\0')) &&
           (ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ ==
            '\0')))))) &&
        (((ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ ==
           '\0' && (ifFalseEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _7_1_ == '\0')) &&
         ((ifFalseEffects.readsTable == false &&
          (((ifFalseEffects.module._5_1_ == '\0' && (ifFalseEffects.writesTable == false)) &&
           ((ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
             (_Base_ptr)0x0 &&
            ((ifFalseEffects.module._4_1_ == '\0' &&
             (ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
              (_Base_ptr)0x0)))))))))))))) {
      nextResult_02.str._M_str = DAT_00da8850;
      nextResult_02.str._M_len = EXPRESSION_RESULT;
      RVar6 = visit(wasm::Expression*,wasm::IString_(this,curr->condition,nextResult_02);
      nextResult_03.str._M_str = DAT_00da8850;
      nextResult_03.str._M_len = EXPRESSION_RESULT;
      RVar2 = visit(wasm::Expression*,wasm::IString_(this,curr->ifTrue,nextResult_03);
      nextResult_04.str._M_str = DAT_00da8850;
      nextResult_04.str._M_len = EXPRESSION_RESULT;
      RVar3 = visit(wasm::Expression*,wasm::IString_(this,curr->ifFalse,nextResult_04);
      RVar6 = cashew::ValueBuilder::makeConditional(RVar6,RVar2,RVar3);
      goto LAB_005c85a5;
    }
  }
  possible.str._M_str = DAT_00da8840;
  possible.str._M_len = (size_t)NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.
                   id,*this,*(Function **)((long)this + 0x18),possible);
  possible_00.str._M_str = DAT_00da8840;
  possible_00.str._M_len = (size_t)NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&tempIfTrue.needFree,
             (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.
                   id,*this,*(Function **)((long)this + 0x18),possible_00);
  possible_01.str._M_str = DAT_00da8840;
  possible_01.str._M_len = (size_t)NO_RESULT;
  RVar6.inst = NO_RESULT;
  ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
            (&tempIfFalse.needFree,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible_01);
  nextResult.str._M_str = DAT_00da8850;
  nextResult.str._M_len = EXPRESSION_RESULT;
  RVar2 = visit(wasm::Expression*,wasm::IString_(this,curr->ifTrue,nextResult);
  nextResult_00.str._M_str = DAT_00da8850;
  nextResult_00.str._M_len = EXPRESSION_RESULT;
  RVar3 = visit(wasm::Expression*,wasm::IString_(this,curr->ifFalse,nextResult_00);
  nextResult_01.str._M_str = DAT_00da8850;
  nextResult_01.str._M_len = EXPRESSION_RESULT;
  RVar4 = visit(wasm::Expression*,wasm::IString_(this,curr->condition,nextResult_01);
  puVar7 = &DAT_00000018;
  pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar5->type = Null;
  cashew::Value::free(pVVar5,puVar7);
  pVVar5->type = String;
  (pVVar5->field_1).ref.inst = (Value *)tempIfTrue.type.id;
  (pVVar5->field_1).str.str._M_str = (char *)tempIfTrue.temp.str._M_len;
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = DAT_00da8ed0;
  RVar2 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar5,cashew::SET,op,RVar6);
  puVar7 = &DAT_00000018;
  pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar5->type = Null;
  cashew::Value::free(pVVar5,puVar7);
  pVVar5->type = String;
  (pVVar5->field_1).ref.inst = (Value *)tempIfFalse.type.id;
  (pVVar5->field_1).str.str._M_str = (char *)tempIfFalse.temp.str._M_len;
  op_00.str._M_str = (char *)RVar3.inst;
  op_00.str._M_len = DAT_00da8ed0;
  RVar3 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar5,cashew::SET,op_00,RVar6);
  puVar7 = &DAT_00000018;
  pVVar5 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  pVVar5->type = Null;
  cashew::Value::free(pVVar5,puVar7);
  pVVar5->type = String;
  (pVVar5->field_1).ref.inst = (Value *)tempCondition.type.id;
  (pVVar5->field_1).str.str._M_str = (char *)tempCondition.temp.str._M_len;
  op_01.str._M_str = (char *)RVar4.inst;
  op_01.str._M_len = DAT_00da8ed0;
  RVar6 = cashew::ValueBuilder::makeBinary((ValueBuilder *)pVVar5,cashew::SET,op_01,RVar6);
  puVar7 = &DAT_00000018;
  RVar4.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (RVar4.inst)->type = Null;
  cashew::Value::free(RVar4.inst,puVar7);
  (RVar4.inst)->type = String;
  ((RVar4.inst)->field_1).ref.inst = (Value *)tempCondition.type.id;
  ((RVar4.inst)->field_1).str.str._M_str = (char *)tempCondition.temp.str._M_len;
  puVar7 = &DAT_00000018;
  ifTrue.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (ifTrue.inst)->type = Null;
  cashew::Value::free(ifTrue.inst,puVar7);
  (ifTrue.inst)->type = String;
  ((ifTrue.inst)->field_1).ref.inst = (Value *)tempIfTrue.type.id;
  ((ifTrue.inst)->field_1).str.str._M_str = (char *)tempIfTrue.temp.str._M_len;
  puVar7 = &DAT_00000018;
  ifFalse.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
  (ifFalse.inst)->type = Null;
  cashew::Value::free(ifFalse.inst,puVar7);
  (ifFalse.inst)->type = String;
  ((ifFalse.inst)->field_1).ref.inst = (Value *)tempIfFalse.type.id;
  ((ifFalse.inst)->field_1).str.str._M_str = (char *)tempIfFalse.temp.str._M_len;
  RVar4 = cashew::ValueBuilder::makeConditional(RVar4,ifTrue,ifFalse);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar6,RVar4);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar3,RVar6);
  RVar6 = cashew::ValueBuilder::makeSeq(RVar2,RVar6);
  processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)&tempIfFalse.needFree);
  processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)&tempIfTrue.needFree);
  processFunctionBody::ExpressionProcessor::ScopedTemp::~ScopedTemp
            ((ScopedTemp *)
             &ifFalseEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_005c85a5:
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifFalseEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifFalseEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifFalseEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count
             );
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifFalseEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&ifFalseEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&ifFalseEffects.features);
  if (ifFalseEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ifFalseEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifTrueEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifTrueEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifTrueEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&ifTrueEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&ifTrueEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&ifTrueEffects.features);
  if (ifTrueEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ifTrueEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&conditionEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&conditionEffects.danglingPop);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&conditionEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)&conditionEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&conditionEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&conditionEffects.features);
  if (conditionEffects.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               conditionEffects.funcEffectsMap.
               super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  return (Ref)RVar6.inst;
}

Assistant:

Ref visitSelect(Select* curr) {
      // If the condition has effects that interact with the operands, we must
      // reorder it to the start. We must also use locals if the values have
      // side effects, as a JS conditional does not visit both sides.
      bool useLocals = false;
      EffectAnalyzer conditionEffects(
        parent->options, *module, curr->condition);
      EffectAnalyzer ifTrueEffects(parent->options, *module, curr->ifTrue);
      EffectAnalyzer ifFalseEffects(parent->options, *module, curr->ifFalse);
      if (conditionEffects.invalidates(ifTrueEffects) ||
          conditionEffects.invalidates(ifFalseEffects) ||
          ifTrueEffects.hasSideEffects() || ifFalseEffects.hasSideEffects()) {
        useLocals = true;
      }
      if (useLocals) {
        ScopedTemp tempIfTrue(curr->type, parent, func),
          tempIfFalse(curr->type, parent, func),
          tempCondition(Type::i32, parent, func);
        Ref ifTrue = visit(curr->ifTrue, EXPRESSION_RESULT);
        Ref ifFalse = visit(curr->ifFalse, EXPRESSION_RESULT);
        Ref condition = visit(curr->condition, EXPRESSION_RESULT);
        return ValueBuilder::makeSeq(
          ValueBuilder::makeBinary(tempIfTrue.getAstName(), SET, ifTrue),
          ValueBuilder::makeSeq(
            ValueBuilder::makeBinary(tempIfFalse.getAstName(), SET, ifFalse),
            ValueBuilder::makeSeq(
              ValueBuilder::makeBinary(
                tempCondition.getAstName(), SET, condition),
              ValueBuilder::makeConditional(tempCondition.getAstName(),
                                            tempIfTrue.getAstName(),
                                            tempIfFalse.getAstName()))));
      } else {
        // Simple case without reordering.
        return ValueBuilder::makeConditional(
          visit(curr->condition, EXPRESSION_RESULT),
          visit(curr->ifTrue, EXPRESSION_RESULT),
          visit(curr->ifFalse, EXPRESSION_RESULT));
      }
    }